

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O0

void __thiscall wasm::SafeHeap::addLoadFunc(SafeHeap *this,Load style,Module *module)

{
  Type indexType_00;
  Name memoryName;
  initializer_list<wasm::Type> __l;
  Signature sig;
  initializer_list<wasm::Type> types;
  Type type;
  bool bVar1;
  BinaryOp op;
  uint bytes;
  Function *pFVar2;
  Memory *this_00;
  Block *this_01;
  LocalGet *pLVar3;
  LocalGet *right;
  Binary *value;
  LocalSet *item;
  Expression *pEVar4;
  address64_t aVar5;
  Load *this_02;
  pointer pFVar6;
  Name NVar7;
  Load *local_1a0;
  Expression *last;
  Load *load;
  Block *block;
  Builder builder;
  allocator<wasm::Type> local_109;
  Type local_108;
  iterator local_100;
  size_type local_f8;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_f0;
  uintptr_t local_d8;
  uintptr_t uStack_d0;
  HeapType local_c0;
  char *local_b8;
  HeapType HStack_b0;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_a8;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  Type local_98;
  uintptr_t local_90;
  iterator local_88;
  undefined8 local_80;
  Type local_78;
  undefined1 auStack_70 [8];
  Signature funcSig;
  Type indexType;
  Memory *memory;
  char *pcStack_28;
  Name name;
  Module *module_local;
  SafeHeap *this_local;
  
  NVar7 = getLoadName(&style);
  pcStack_28 = NVar7.super_IString.str._M_len;
  name.super_IString.str._M_len = NVar7.super_IString.str._M_str;
  pFVar2 = Module::getFunctionOrNull(module,NVar7);
  if (pFVar2 == (Function *)0x0) {
    this_00 = Module::getMemory(module,style.memory);
    local_98.id = (this_00->indexType).id;
    local_88 = &local_98;
    local_80 = 2;
    types._M_len = 2;
    types._M_array = local_88;
    local_90 = local_98.id;
    funcSig.results.id = local_98.id;
    wasm::Type::Type(&local_78,types);
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.id;
    Signature::Signature
              ((Signature *)auStack_70,local_78,
               style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type);
    local_b8 = pcStack_28;
    HStack_b0.id = name.super_IString.str._M_len;
    local_d8 = (uintptr_t)auStack_70;
    uStack_d0 = funcSig.params.id;
    sig.results.id = funcSig.params.id;
    sig.params.id = (uintptr_t)auStack_70;
    HeapType::HeapType(&local_c0,sig);
    local_108.id = funcSig.results.id;
    local_100 = &local_108;
    local_f8 = 1;
    std::allocator<wasm::Type>::allocator(&local_109);
    __l._M_len = local_f8;
    __l._M_array = local_100;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_f0,__l,&local_109);
    NVar7.super_IString.str._M_str = local_b8;
    NVar7.super_IString.str._M_len = (size_t)&local_a8;
    Builder::makeFunction
              (NVar7,HStack_b0,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_c0.id,
               (Expression *)&local_f0);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_f0);
    std::allocator<wasm::Type>::~allocator(&local_109);
    Builder::Builder((Builder *)&block,module);
    this_01 = Builder::makeBlock((Builder *)&block,(Expression *)0x0);
    bVar1 = Memory::is64(this_00);
    op = AddInt32;
    if (bVar1) {
      op = AddInt64;
    }
    pLVar3 = Builder::makeLocalGet((Builder *)&block,0,funcSig.results);
    right = Builder::makeLocalGet((Builder *)&block,1,funcSig.results);
    value = Builder::makeBinary((Builder *)&block,op,(Expression *)pLVar3,(Expression *)right);
    item = Builder::makeLocalSet((Builder *)&block,2,(Expression *)value);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_01->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
    type.id = style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.id;
    bytes = (uint)style.bytes;
    indexType_00.id = (this_00->indexType).id;
    bVar1 = Memory::is64(this_00);
    pEVar4 = makeBoundsCheck(this,type,(Builder *)&block,2,bytes,module,indexType_00,bVar1,
                             (Name)(this_00->super_Importable).super_Named.name.super_IString.str);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_01->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar4);
    aVar5 = wasm::Address::operator_cast_to_unsigned_long(&style.align);
    if (1 < aVar5) {
      memoryName.super_IString.str._M_str._4_4_ =
           (int)((ulong)(this_00->super_Importable).super_Named.name.super_IString.str._M_str >>
                0x20);
      memoryName.super_IString.str._0_12_ =
           *(undefined1 (*) [12])&(this_00->super_Importable).super_Named.name.super_IString.str;
      pEVar4 = makeAlignCheck(this,style.align,(Builder *)&block,2,module,memoryName);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(this_01->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar4)
      ;
    }
    this_02 = MixedArena::alloc<wasm::Load>(&module->allocator);
    Load::operator=(this_02,&style);
    pLVar3 = Builder::makeLocalGet((Builder *)&block,2,funcSig.results);
    this_02->ptr = (Expression *)pLVar3;
    local_1a0 = this_02;
    if (((this_02->isAtomic & 1U) != 0) && ((this_02->signed_ & 1U) != 0)) {
      local_1a0 = (Load *)Bits::makeSignExt((Expression *)this_02,(uint)this_02->bytes,module);
      this_02->signed_ = false;
    }
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_01->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)local_1a0);
    Block::finalize(this_01,style.super_SpecificExpression<(wasm::Expression::Id)12>.
                            super_Expression.type);
    pFVar6 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_a8);
    pFVar6->body = (Expression *)this_01;
    Module::addFunction(module,&local_a8);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_a8);
  }
  return;
}

Assistant:

void addLoadFunc(Load style, Module* module) {
    auto name = getLoadName(&style);
    if (module->getFunctionOrNull(name)) {
      return;
    }
    // pointer, offset
    auto memory = module->getMemory(style.memory);
    auto indexType = memory->indexType;
    auto funcSig = Signature({indexType, indexType}, style.type);
    auto func = Builder::makeFunction(name, funcSig, {indexType});
    Builder builder(*module);
    auto* block = builder.makeBlock();
    block->list.push_back(builder.makeLocalSet(
      2,
      builder.makeBinary(memory->is64() ? AddInt64 : AddInt32,
                         builder.makeLocalGet(0, indexType),
                         builder.makeLocalGet(1, indexType))));
    // check for reading past valid memory: if pointer + offset + bytes
    block->list.push_back(makeBoundsCheck(style.type,
                                          builder,
                                          2,
                                          style.bytes,
                                          module,
                                          memory->indexType,
                                          memory->is64(),
                                          memory->name));
    // check proper alignment
    if (style.align > 1) {
      block->list.push_back(
        makeAlignCheck(style.align, builder, 2, module, memory->name));
    }
    // do the load
    auto* load = module->allocator.alloc<Load>();
    *load = style; // basically the same as the template we are given!
    load->ptr = builder.makeLocalGet(2, indexType);
    Expression* last = load;
    if (load->isAtomic && load->signed_) {
      // atomic loads cannot be signed, manually sign it
      last = Bits::makeSignExt(load, load->bytes, *module);
      load->signed_ = false;
    }
    block->list.push_back(last);
    block->finalize(style.type);
    func->body = block;
    module->addFunction(std::move(func));
  }